

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::texImage3D
          (ReferenceContext *this,deUint32 target,int level,deUint32 internalFormat,int width,
          int height,int depth,int border,deUint32 format,deUint32 type,void *data)

{
  uint uVar1;
  DataBuffer *pDVar2;
  pointer puVar3;
  undefined8 uVar4;
  uint uVar5;
  PixelBufferAccess *pPVar6;
  void *pvVar7;
  Texture1D *pTVar8;
  long lVar9;
  long lVar10;
  Texture3D *pTVar11;
  Texture2DArray *pTVar12;
  TextureCubeArray *pTVar13;
  TextureCube *pTVar14;
  ChannelOrder CVar15;
  pointer puVar16;
  Texture2D *pTVar17;
  ConstPixelBufferAccess src;
  undefined8 local_190;
  undefined4 auStack_188 [6];
  void *local_170;
  ulong local_168;
  pointer local_160;
  TextureFormat local_158;
  TextureFormat local_150;
  ConstPixelBufferAccess local_148;
  PixelBufferAccess local_120;
  PixelBufferAccess local_f8;
  PixelBufferAccess local_d0;
  PixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  pDVar2 = this->m_pixelUnpackBufferBinding;
  if (pDVar2 != (DataBuffer *)0x0) {
    puVar3 = (pDVar2->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar16 = (pointer)0x0;
    if (puVar3 != (pDVar2->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      puVar16 = puVar3;
    }
    data = (void *)((long)data + (long)puVar16);
  }
  if ((border == 0) && (-1 < (width | level | height | depth))) {
    local_160 = (this->m_textureUnits).
                super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
    local_150 = mapInternalFormat(internalFormat);
    CVar15 = local_150.order;
    local_168 = (ulong)local_150 >> 0x20;
    if ((CVar15 == CHANNELORDER_LAST || local_168 == 0x26) ||
       (local_158 = glu::mapGLTransferFormat(format,type),
       local_158.order == CHANNELORDER_LAST || local_158.type == CHANNELTYPE_LAST)) {
LAB_00813624:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    if (target == 0xde1) {
      uVar1 = (this->m_limits).maxTexture2DSize;
      if ((width <= (int)uVar1) && (depth == 1 && height <= (int)uVar1)) {
        if (uVar1 == 0) {
          uVar5 = 0x20;
        }
        else {
          uVar5 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar5)) {
          pTVar17 = &local_160->default2DTex;
          if (local_160->tex2DBinding != (Texture2D *)0x0) {
            pTVar17 = local_160->tex2DBinding;
          }
          if ((pTVar17->super_Texture).m_immutable == true) {
            if ((((0xd < (uint)level) ||
                 (*(long *)((long)((pTVar17->m_levels).m_data + (uint)level) + 8) == 0)) ||
                (uVar4 = *(undefined8 *)((pTVar17->m_levels).m_access + (uint)level),
                CVar15 != (ChannelOrder)uVar4)) ||
               ((((int)local_168 != (int)((ulong)uVar4 >> 0x20) ||
                 (*(int *)((long)((pTVar17->m_levels).m_access + (uint)level) + 8) != width)) ||
                (*(int *)((long)((pTVar17->m_levels).m_access + (uint)level) + 0xc) != height))))
            goto LAB_00814046;
          }
          else {
            rc::TextureLevelArray::allocLevel(&pTVar17->m_levels,level,&local_150,width,height,1);
          }
          if ((pointer)data != (pointer)0x0) {
            getUnpack2DAccess(&local_148,this,&local_158,width,height,data);
            pPVar6 = (pTVar17->m_levels).m_access + level;
            local_190 = (pPVar6->super_ConstPixelBufferAccess).m_format;
            lVar9 = 0;
            do {
              auStack_188[lVar9] =
                   *(undefined4 *)((long)((pTVar17->m_levels).m_access + level) + 8U + lVar9 * 4);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar9 = 0;
            do {
              auStack_188[lVar9 + 3] =
                   *(undefined4 *)((long)((pTVar17->m_levels).m_access + level) + 0x14U + lVar9 * 4)
              ;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            goto LAB_008140f8;
          }
          local_80.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)((pTVar17->m_levels).m_access + level);
          lVar9 = 0;
          do {
            local_80.super_ConstPixelBufferAccess.m_size.m_data[lVar9] =
                 *(int *)((long)((pTVar17->m_levels).m_access + level) + 8U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar9 = 0;
          do {
            local_80.super_ConstPixelBufferAccess.m_pitch.m_data[lVar9] =
                 *(int *)((long)((pTVar17->m_levels).m_access + level) + 0x14U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          pvVar7 = *(void **)((long)((pTVar17->m_levels).m_access + level) + 0x20);
          pPVar6 = &local_80;
          goto LAB_0081422a;
        }
      }
    }
    else if (target == 0xde0) {
      if (((this->m_limits).contextType.super_ApiType.m_bits & 0x300) != 0x100) goto LAB_00813624;
      if (((depth == 1) && (height == 1)) &&
         (uVar1 = (this->m_limits).maxTexture2DSize, width <= (int)uVar1)) {
        if (uVar1 == 0) {
          uVar5 = 0x20;
        }
        else {
          uVar5 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar5)) {
          pTVar8 = &local_160->default1DTex;
          if (local_160->tex1DBinding != (Texture1D *)0x0) {
            pTVar8 = local_160->tex1DBinding;
          }
          if ((pTVar8->super_Texture).m_immutable == true) {
            if ((((0xd < (uint)level) ||
                 (*(long *)((long)((pTVar8->m_levels).m_data + (uint)level) + 8) == 0)) ||
                (uVar4 = *(undefined8 *)((pTVar8->m_levels).m_access + (uint)level),
                CVar15 != (ChannelOrder)uVar4)) ||
               (((int)local_168 != (int)((ulong)uVar4 >> 0x20) ||
                (*(int *)((long)((pTVar8->m_levels).m_access + (uint)level) + 8) != width))))
            goto LAB_00814046;
          }
          else {
            rc::TextureLevelArray::allocLevel(&pTVar8->m_levels,level,&local_150,width,1,1);
          }
          if ((pointer)data != (pointer)0x0) {
            getUnpack2DAccess(&local_148,this,&local_158,width,1,data);
            pPVar6 = (pTVar8->m_levels).m_access + level;
            local_190 = (pPVar6->super_ConstPixelBufferAccess).m_format;
            lVar9 = 0;
            do {
              auStack_188[lVar9] =
                   *(undefined4 *)((long)((pTVar8->m_levels).m_access + level) + 8U + lVar9 * 4);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar9 = 0;
            do {
              auStack_188[lVar9 + 3] =
                   *(undefined4 *)((long)((pTVar8->m_levels).m_access + level) + 0x14U + lVar9 * 4);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            goto LAB_008140f8;
          }
          local_58.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)((pTVar8->m_levels).m_access + level);
          lVar9 = 0;
          do {
            local_58.super_ConstPixelBufferAccess.m_size.m_data[lVar9] =
                 *(int *)((long)((pTVar8->m_levels).m_access + level) + 8U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar9 = 0;
          do {
            local_58.super_ConstPixelBufferAccess.m_pitch.m_data[lVar9] =
                 *(int *)((long)((pTVar8->m_levels).m_access + level) + 0x14U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          pvVar7 = *(void **)((long)((pTVar8->m_levels).m_access + level) + 0x20);
          pPVar6 = &local_58;
          goto LAB_0081422a;
        }
      }
    }
    else if (target - 0x8515 < 6) {
      if ((width == height) &&
         (uVar1 = (this->m_limits).maxTextureCubeSize, depth == 1 && width <= (int)uVar1)) {
        if (uVar1 == 0) {
          uVar5 = 0x20;
        }
        else {
          uVar5 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar5)) {
          pTVar14 = &local_160->defaultCubeTex;
          if (local_160->texCubeBinding != (TextureCube *)0x0) {
            pTVar14 = local_160->texCubeBinding;
          }
          lVar9 = *(long *)(&DAT_009d0778 + (long)(short)((short)target + 0x7aeb) * 8);
          if ((pTVar14->super_Texture).m_immutable == true) {
            if (((((0xd < (uint)level) ||
                  (*(long *)((long)(pTVar14->m_levels[lVar9].m_data + (uint)level) + 8) == 0)) ||
                 (uVar4 = pTVar14->m_levels[lVar9].m_access[(uint)level].
                          super_ConstPixelBufferAccess.m_format, CVar15 != (ChannelOrder)uVar4)) ||
                (((int)local_168 != (int)((ulong)uVar4 >> 0x20) ||
                 (*(int *)((long)(pTVar14->m_levels[lVar9].m_access + (uint)level) + 8) != width))))
               || (*(int *)((long)(pTVar14->m_levels[lVar9].m_access + (uint)level) + 0xc) != width)
               ) {
LAB_00814046:
              if (this->m_lastError != 0) {
                return;
              }
              this->m_lastError = 0x502;
              return;
            }
          }
          else {
            rc::TextureLevelArray::allocLevel
                      (pTVar14->m_levels + lVar9,level,&local_150,width,width,1);
          }
          if ((pointer)data != (pointer)0x0) {
            getUnpack2DAccess(&local_148,this,&local_158,width,width,data);
            pPVar6 = pTVar14->m_levels[lVar9].m_access + level;
            local_190 = (pPVar6->super_ConstPixelBufferAccess).m_format;
            lVar10 = 0;
            do {
              auStack_188[lVar10] =
                   *(undefined4 *)
                    ((long)(pTVar14->m_levels[lVar9].m_access + level) + 8U + lVar10 * 4);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            lVar10 = 0;
            do {
              auStack_188[lVar10 + 3] =
                   *(undefined4 *)
                    ((long)(pTVar14->m_levels[lVar9].m_access + level) + 0x14U + lVar10 * 4);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
LAB_008140f8:
            local_170 = *(void **)((long)&pPVar6->super_ConstPixelBufferAccess + 0x20);
            if ((internalFormat & 0xfffffffe) == 0x8cac) {
              depthValueFloatClampCopy((PixelBufferAccess *)&local_190,&local_148);
              return;
            }
            tcu::copy((EVP_PKEY_CTX *)&local_190,(EVP_PKEY_CTX *)&local_148);
            return;
          }
          local_a8.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)(pTVar14->m_levels[lVar9].m_access + level);
          lVar10 = 0;
          do {
            local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar10] =
                 *(int *)((long)(pTVar14->m_levels[lVar9].m_access + level) + 8U + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar10 = 0;
          do {
            local_a8.super_ConstPixelBufferAccess.m_pitch.m_data[lVar10] =
                 *(int *)((long)(pTVar14->m_levels[lVar9].m_access + level) + 0x14U + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          pvVar7 = *(void **)((long)(pTVar14->m_levels[lVar9].m_access + level) + 0x20);
          pPVar6 = &local_a8;
LAB_0081422a:
          (pPVar6->super_ConstPixelBufferAccess).m_data = pvVar7;
          clearToTextureInitialValue(pPVar6);
          return;
        }
      }
    }
    else if (target == 0x806f) {
      uVar1 = (this->m_limits).maxTexture3DSize;
      if (((depth <= (int)uVar1) && (width <= (int)uVar1)) && (height <= (int)uVar1)) {
        if (uVar1 == 0) {
          uVar5 = 0x20;
        }
        else {
          uVar5 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar5)) {
          pTVar11 = &local_160->default3DTex;
          if (local_160->tex3DBinding != (Texture3D *)0x0) {
            pTVar11 = local_160->tex3DBinding;
          }
          if ((pTVar11->super_Texture).m_immutable == true) {
            if (((((0xd < (uint)level) ||
                  (*(long *)((long)((pTVar11->m_levels).m_data + (uint)level) + 8) == 0)) ||
                 (uVar4 = *(undefined8 *)((pTVar11->m_levels).m_access + (uint)level),
                 CVar15 != (ChannelOrder)uVar4)) ||
                (((int)local_168 != (int)((ulong)uVar4 >> 0x20) ||
                 (*(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 8) != width)))) ||
               ((*(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 0xc) != height ||
                (*(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 0x10) != depth))))
            goto LAB_00814046;
          }
          else {
            rc::TextureLevelArray::allocLevel
                      (&pTVar11->m_levels,level,&local_150,width,height,depth);
          }
          if ((pointer)data != (pointer)0x0) {
            getUnpack3DAccess(&local_148,this,&local_158,width,height,depth,data);
            pPVar6 = (pTVar11->m_levels).m_access + level;
            local_190 = (pPVar6->super_ConstPixelBufferAccess).m_format;
            lVar9 = 0;
            do {
              auStack_188[lVar9] =
                   *(undefined4 *)((long)((pTVar11->m_levels).m_access + level) + 8U + lVar9 * 4);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar9 = 0;
            do {
              auStack_188[lVar9 + 3] =
                   *(undefined4 *)((long)((pTVar11->m_levels).m_access + level) + 0x14U + lVar9 * 4)
              ;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            goto LAB_008140f8;
          }
          local_f8.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)((pTVar11->m_levels).m_access + level);
          lVar9 = 0;
          do {
            local_f8.super_ConstPixelBufferAccess.m_size.m_data[lVar9] =
                 *(int *)((long)((pTVar11->m_levels).m_access + level) + 8U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar9 = 0;
          do {
            local_f8.super_ConstPixelBufferAccess.m_pitch.m_data[lVar9] =
                 *(int *)((long)((pTVar11->m_levels).m_access + level) + 0x14U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          pvVar7 = *(void **)((long)((pTVar11->m_levels).m_access + level) + 0x20);
          pPVar6 = &local_f8;
          goto LAB_0081422a;
        }
      }
    }
    else if (target == 0x9009) {
      if (((width == height) &&
          (((uint)(depth * -0x55555555) >> 1 | (uint)((depth * -0x55555555 & 1U) != 0) << 0x1f) <
           0x2aaaaaab)) &&
         ((uVar1 = (this->m_limits).maxTexture2DSize, width <= (int)uVar1 &&
          (depth <= (this->m_limits).maxTexture2DArrayLayers)))) {
        if (uVar1 == 0) {
          uVar5 = 0x20;
        }
        else {
          uVar5 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar5)) {
          pTVar13 = &local_160->defaultCubeArrayTex;
          if (local_160->texCubeArrayBinding != (TextureCubeArray *)0x0) {
            pTVar13 = local_160->texCubeArrayBinding;
          }
          if ((pTVar13->super_Texture).m_immutable == true) {
            if ((((0xd < (uint)level) ||
                 (*(long *)((long)((pTVar13->m_levels).m_data + (uint)level) + 8) == 0)) ||
                (uVar4 = *(undefined8 *)((pTVar13->m_levels).m_access + (uint)level),
                CVar15 != (ChannelOrder)uVar4)) ||
               ((((int)local_168 != (int)((ulong)uVar4 >> 0x20) ||
                 (*(int *)((long)((pTVar13->m_levels).m_access + (uint)level) + 8) != width)) ||
                ((*(int *)((long)((pTVar13->m_levels).m_access + (uint)level) + 0xc) != width ||
                 (*(int *)((long)((pTVar13->m_levels).m_access + (uint)level) + 0x10) != depth))))))
            goto LAB_00814046;
          }
          else {
            rc::TextureLevelArray::allocLevel(&pTVar13->m_levels,level,&local_150,width,width,depth)
            ;
          }
          if ((pointer)data != (pointer)0x0) {
            getUnpack3DAccess(&local_148,this,&local_158,width,width,depth,data);
            pPVar6 = (pTVar13->m_levels).m_access + level;
            local_190 = (pPVar6->super_ConstPixelBufferAccess).m_format;
            lVar9 = 0;
            do {
              auStack_188[lVar9] =
                   *(undefined4 *)((long)((pTVar13->m_levels).m_access + level) + 8U + lVar9 * 4);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar9 = 0;
            do {
              auStack_188[lVar9 + 3] =
                   *(undefined4 *)((long)((pTVar13->m_levels).m_access + level) + 0x14U + lVar9 * 4)
              ;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            goto LAB_008140f8;
          }
          local_120.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)((pTVar13->m_levels).m_access + level);
          lVar9 = 0;
          do {
            local_120.super_ConstPixelBufferAccess.m_size.m_data[lVar9] =
                 *(int *)((long)((pTVar13->m_levels).m_access + level) + 8U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar9 = 0;
          do {
            local_120.super_ConstPixelBufferAccess.m_pitch.m_data[lVar9] =
                 *(int *)((long)((pTVar13->m_levels).m_access + level) + 0x14U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          pvVar7 = *(void **)((long)((pTVar13->m_levels).m_access + level) + 0x20);
          pPVar6 = &local_120;
          goto LAB_0081422a;
        }
      }
    }
    else {
      if (target != 0x8c1a) goto LAB_00813624;
      uVar1 = (this->m_limits).maxTexture2DSize;
      if (((width <= (int)uVar1) && (height <= (int)uVar1)) &&
         (depth <= (this->m_limits).maxTexture2DArrayLayers)) {
        if (uVar1 == 0) {
          uVar5 = 0x20;
        }
        else {
          uVar5 = 0x1f;
          if (uVar1 != 0) {
            for (; uVar1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        if (level <= (int)(0x1f - uVar5)) {
          pTVar12 = &local_160->default2DArrayTex;
          if (local_160->tex2DArrayBinding != (Texture2DArray *)0x0) {
            pTVar12 = local_160->tex2DArrayBinding;
          }
          if ((pTVar12->super_Texture).m_immutable == true) {
            if ((((0xd < (uint)level) ||
                 (*(long *)((long)((pTVar12->m_levels).m_data + (uint)level) + 8) == 0)) ||
                (uVar4 = *(undefined8 *)((pTVar12->m_levels).m_access + (uint)level),
                CVar15 != (ChannelOrder)uVar4)) ||
               ((((int)local_168 != (int)((ulong)uVar4 >> 0x20) ||
                 (*(int *)((long)((pTVar12->m_levels).m_access + (uint)level) + 8) != width)) ||
                ((*(int *)((long)((pTVar12->m_levels).m_access + (uint)level) + 0xc) != height ||
                 (*(int *)((long)((pTVar12->m_levels).m_access + (uint)level) + 0x10) != depth))))))
            goto LAB_00814046;
          }
          else {
            rc::TextureLevelArray::allocLevel
                      (&pTVar12->m_levels,level,&local_150,width,height,depth);
          }
          if ((pointer)data != (pointer)0x0) {
            getUnpack3DAccess(&local_148,this,&local_158,width,height,depth,data);
            pPVar6 = (pTVar12->m_levels).m_access + level;
            local_190 = (pPVar6->super_ConstPixelBufferAccess).m_format;
            lVar9 = 0;
            do {
              auStack_188[lVar9] =
                   *(undefined4 *)((long)((pTVar12->m_levels).m_access + level) + 8U + lVar9 * 4);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar9 = 0;
            do {
              auStack_188[lVar9 + 3] =
                   *(undefined4 *)((long)((pTVar12->m_levels).m_access + level) + 0x14U + lVar9 * 4)
              ;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            goto LAB_008140f8;
          }
          local_d0.super_ConstPixelBufferAccess.m_format =
               *(TextureFormat *)((pTVar12->m_levels).m_access + level);
          lVar9 = 0;
          do {
            local_d0.super_ConstPixelBufferAccess.m_size.m_data[lVar9] =
                 *(int *)((long)((pTVar12->m_levels).m_access + level) + 8U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          lVar9 = 0;
          do {
            local_d0.super_ConstPixelBufferAccess.m_pitch.m_data[lVar9] =
                 *(int *)((long)((pTVar12->m_levels).m_access + level) + 0x14U + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          pvVar7 = *(void **)((long)((pTVar12->m_levels).m_access + level) + 0x20);
          pPVar6 = &local_d0;
          goto LAB_0081422a;
        }
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::texImage3D (deUint32 target, int level, deUint32 internalFormat, int width, int height, int depth, int border, deUint32 format, deUint32 type, const void* data)
{
	TextureUnit&		unit					= m_textureUnits[m_activeTexture];
	const void*			unpackPtr				= getPixelUnpackPtr(data);
	const bool			isDstFloatDepthFormat	= (internalFormat == GL_DEPTH_COMPONENT32F || internalFormat == GL_DEPTH32F_STENCIL8); // depth components are limited to [0,1] range
	TextureFormat		storageFmt;
	TextureFormat		transferFmt;

	RC_IF_ERROR(border != 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || depth < 0 || level < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	// Map transfer format.
	transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_1D && glu::isContextTypeGLCore(m_limits.contextType))
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height != 1 || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture1D* texture = unit.tex1DBinding ? unit.tex1DBinding : &unit.default1DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, 1, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_2D)
	{
		// Validate size and level.
		RC_IF_ERROR(width > m_limits.maxTexture2DSize || height > m_limits.maxTexture2DSize || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2D* texture = unit.tex2DBinding ? unit.tex2DBinding : &unit.default2DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, height, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		// Validate size and level.
		RC_IF_ERROR(width != height || width > m_limits.maxTextureCubeSize || depth != 1, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTextureCubeSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCube*	texture	= unit.texCubeBinding ? unit.texCubeBinding : &unit.defaultCubeTex;
		tcu::CubeFace	face	= mapGLCubeFace(target);

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasFace(level, face), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getFace(level, face));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocFace(level, face, storageFmt, width, height);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack2DAccess(transferFmt, width, height, unpackPtr);
			PixelBufferAccess		dst		(texture->getFace(level, face));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getFace(level, face));
		}
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		// Validate size and level.
		RC_IF_ERROR(width	> m_limits.maxTexture2DSize ||
					height	> m_limits.maxTexture2DSize ||
					depth	> m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture2DArray* texture = unit.tex2DArrayBinding ? unit.tex2DArrayBinding : &unit.default2DArrayTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_3D)
	{
		// Validate size and level.
		RC_IF_ERROR(width	> m_limits.maxTexture3DSize ||
					height	> m_limits.maxTexture3DSize ||
					depth	> m_limits.maxTexture3DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture3DSize), GL_INVALID_VALUE, RC_RET_VOID);

		Texture3D* texture = unit.tex3DBinding ? unit.tex3DBinding : &unit.default3DTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		// Validate size and level.
		RC_IF_ERROR(width		!= height						||
					width		 > m_limits.maxTexture2DSize	||
					depth % 6	!= 0							||
					depth		 > m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(level > deLog2Floor32(m_limits.maxTexture2DSize), GL_INVALID_VALUE, RC_RET_VOID);

		TextureCubeArray* texture = unit.texCubeArrayBinding ? unit.texCubeArrayBinding : &unit.defaultCubeArrayTex;

		if (texture->isImmutable())
		{
			RC_IF_ERROR(!texture->hasLevel(level), GL_INVALID_OPERATION, RC_RET_VOID);

			ConstPixelBufferAccess dst(texture->getLevel(level));
			RC_IF_ERROR(storageFmt	!= dst.getFormat()	||
						width		!= dst.getWidth()	||
						height		!= dst.getHeight()	||
						depth		!= dst.getDepth(), GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
			texture->allocLevel(level, storageFmt, width, height, depth);

		if (unpackPtr)
		{
			ConstPixelBufferAccess	src		= getUnpack3DAccess(transferFmt, width, height, depth, unpackPtr);
			PixelBufferAccess		dst		(texture->getLevel(level));

			if (isDstFloatDepthFormat)
				depthValueFloatClampCopy(dst, src);
			else
				tcu::copy(dst, src);
		}
		else
		{
			// No data supplied, clear to initial
			clearToTextureInitialValue(texture->getLevel(level));
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}